

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  TextRecorder *this;
  TextRecordMemento *m;
  TextRecordMemento *m_00;
  allocator<char> local_39;
  string local_38 [32];
  
  this = (TextRecorder *)operator_new(0x28);
  TextRecorder::TextRecorder(this);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"sentence 1",&local_39);
  std::__cxx11::string::_M_assign((string *)&this->_text);
  std::__cxx11::string::~string(local_38);
  m = TextRecorder::createMemo(this);
  TextRecorder::print(this);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"sentence 2",&local_39);
  std::__cxx11::string::_M_assign((string *)&this->_text);
  std::__cxx11::string::~string(local_38);
  m_00 = TextRecorder::createMemo(this);
  TextRecorder::print(this);
  TextRecorder::loadMemo(this,m);
  TextRecorder::print(this);
  TextRecorder::loadMemo(this,m_00);
  TextRecorder::print(this);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	TextRecorder* recorder = new TextRecorder;

	recorder->setText("sentence 1");
	TextRecordMemento* m1 = recorder->createMemo();
	recorder->print();

	recorder->setText("sentence 2");
	TextRecordMemento* m2 = recorder->createMemo();
	recorder->print();

	recorder->loadMemo(m1);
	recorder->print();

	recorder->loadMemo(m2);
	recorder->print();

	return 0;
}